

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

void duckdb::InsertToken(tokenType insert_type,idx_t insert_pos,
                        vector<duckdb::highlightToken,_true> *tokens)

{
  value_type *pvVar1;
  reference pvVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_RDX;
  size_t in_RSI;
  tokenType in_DIL;
  highlightToken token_2;
  highlightToken token_1;
  highlightToken token;
  bool found;
  idx_t i;
  vector<duckdb::highlightToken,_true> new_tokens;
  highlightToken *in_stack_fffffffffffffef8;
  reference in_stack_ffffffffffffff00;
  value_type *in_stack_ffffffffffffff08;
  value_type *pvVar5;
  reference in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff28;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_stack_ffffffffffffff30
  ;
  highlightToken local_98;
  highlightToken local_80;
  highlightToken local_68;
  byte local_49;
  value_type *local_48;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *local_18;
  size_t local_10;
  tokenType local_1;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1 = in_DIL;
  vector<duckdb::highlightToken,_true>::vector((vector<duckdb::highlightToken,_true> *)0x202863);
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size(local_18);
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_49 = 0;
  local_48 = (value_type *)0x0;
  do {
    pvVar5 = local_48;
    pvVar1 = (value_type *)
             ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
                       (local_18);
    if (pvVar1 <= pvVar5) {
LAB_00202b6b:
      while (pvVar5 = local_48,
            pvVar1 = (value_type *)
                     ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ::size(local_18), pvVar5 < pvVar1) {
        in_stack_ffffffffffffff00 =
             vector<duckdb::highlightToken,_true>::operator[]
                       ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                        (size_type)in_stack_fffffffffffffef8);
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                   in_stack_ffffffffffffff10,pvVar5);
        local_48 = (value_type *)&local_48->field_0x1;
      }
      if ((local_49 & 1) == 0) {
        in_stack_fffffffffffffef8 = &local_98;
        highlightToken::highlightToken(in_stack_fffffffffffffef8);
        local_98.start = local_10;
        local_98.type = local_1;
        local_98.search_match = false;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                   in_stack_ffffffffffffff10,pvVar5);
      }
      vector<duckdb::highlightToken,_true>::operator=
                ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                 (vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffef8);
      vector<duckdb::highlightToken,_true>::~vector
                ((vector<duckdb::highlightToken,_true> *)0x202c49);
      return;
    }
    pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                       ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                        (size_type)in_stack_fffffffffffffef8);
    if (pvVar2->start == local_10) {
      highlightToken::highlightToken(&local_68);
      local_68.start = local_10;
      local_68.type = local_1;
      local_68.search_match = false;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      puVar3 = &local_48->field_0x1;
      puVar4 = (undefined1 *)
               ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
                         (local_18);
      if ((puVar4 <= puVar3) ||
         (pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                             ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                              (size_type)in_stack_fffffffffffffef8), local_10 + 1 < pvVar2->start))
      {
        local_68.start = local_10 + 1;
        pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                           ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                            (size_type)in_stack_fffffffffffffef8);
        local_68.type = pvVar2->type;
        local_68.search_match = false;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                   in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      local_48 = (value_type *)&local_48->field_0x1;
      local_49 = 1;
      goto LAB_00202b6b;
    }
    pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                       ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                        (size_type)in_stack_fffffffffffffef8);
    if (local_10 < pvVar2->start) {
      highlightToken::highlightToken(&local_80);
      local_80.start = local_10;
      local_80.type = local_1;
      local_80.search_match = false;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      vector<duckdb::highlightToken,_true>::operator[]
                ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                 (size_type)in_stack_fffffffffffffef8);
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_48 = (value_type *)&local_48->field_0x1;
      local_49 = 1;
      goto LAB_00202b6b;
    }
    in_stack_ffffffffffffff10 =
         vector<duckdb::highlightToken,_true>::operator[]
                   ((vector<duckdb::highlightToken,_true> *)in_stack_ffffffffffffff00,
                    (size_type)in_stack_fffffffffffffef8);
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
              ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_48 = (value_type *)&local_48->field_0x1;
  } while( true );
}

Assistant:

void InsertToken(tokenType insert_type, idx_t insert_pos, vector<highlightToken> &tokens) {
	vector<highlightToken> new_tokens;
	new_tokens.reserve(tokens.size() + 1);
	idx_t i;
	bool found = false;
	for (i = 0; i < tokens.size(); i++) {
		// find the exact position where we need to insert the token
		if (tokens[i].start == insert_pos) {
			// this token is exactly at this render position

			// insert highlighting for the bracket
			highlightToken token;
			token.start = insert_pos;
			token.type = insert_type;
			token.search_match = false;
			new_tokens.push_back(token);

			// now we need to insert the other token ONLY if the other token is not immediately following this one
			if (i + 1 >= tokens.size() || tokens[i + 1].start > insert_pos + 1) {
				token.start = insert_pos + 1;
				token.type = tokens[i].type;
				token.search_match = false;
				new_tokens.push_back(token);
			}
			i++;
			found = true;
			break;
		} else if (tokens[i].start > insert_pos) {
			// the next token is AFTER the render position
			// insert highlighting for the bracket
			highlightToken token;
			token.start = insert_pos;
			token.type = insert_type;
			token.search_match = false;
			new_tokens.push_back(token);

			// now just insert the next token
			new_tokens.push_back(tokens[i]);
			i++;
			found = true;
			break;
		} else {
			// insert the token
			new_tokens.push_back(tokens[i]);
		}
	}
	// copy over the remaining tokens
	for (; i < tokens.size(); i++) {
		new_tokens.push_back(tokens[i]);
	}
	if (!found) {
		// token was not added - add it to the end
		highlightToken token;
		token.start = insert_pos;
		token.type = insert_type;
		token.search_match = false;
		new_tokens.push_back(token);
	}
	tokens = std::move(new_tokens);
}